

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetServerOrientation(VClient *this,Enum *o_rServerOrientation)

{
  char cVar1;
  Enum EVar2;
  Enum EVar3;
  scoped_lock Lock;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  EVar3 = NotSupported;
  EVar2 = Unknown;
  if ((this->m_CachedFrame).m_ApplicationInfo.super_type.m_initialized == true) {
    cVar1 = (this->m_CachedFrame).m_ApplicationInfo.super_type.m_storage.dummy_.data[8];
    EVar3 = Success;
    if (cVar1 == '\x01') {
      EVar2 = YUp;
    }
    else {
      EVar2 = Unknown;
      if (cVar1 == '\0') {
        EVar2 = ZUp;
      }
    }
  }
  *o_rServerOrientation = EVar2;
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return EVar3;
}

Assistant:

Result::Enum VClient::GetServerOrientation( ServerOrientation::Enum & o_rServerOrientation ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  if( m_CachedFrame.m_ApplicationInfo )
  {
    switch(m_CachedFrame.m_ApplicationInfo.get().m_AxisOrientation )
    {
      case  ViconCGStream::VApplicationInfo::EYUp:
        o_rServerOrientation = ServerOrientation::YUp;
        break;
      case ViconCGStream::VApplicationInfo::EZUp:
        o_rServerOrientation = ServerOrientation::ZUp;
        break;
      default:
        o_rServerOrientation=ServerOrientation::Unknown;
        break;
    }
    return Result::Success;
  }
  else
  {
    o_rServerOrientation=ServerOrientation::Unknown;
    return Result::NotSupported;
  }
  
}